

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::leaky_relu(tensor *dest,tensor *src,float alpha)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  size_t sVar3;
  long *in_RSI;
  tensor *in_RDI;
  float in_XMM0_Da;
  size_t i;
  float *d;
  float *s;
  ulong local_30;
  
  lVar2 = (**(code **)(*in_RSI + 0x10))();
  iVar1 = (*in_RDI->_vptr_tensor[3])();
  local_30 = 0;
  while( true ) {
    sVar3 = tensor::size(in_RDI);
    if (sVar3 <= local_30) break;
    if (*(float *)(lVar2 + local_30 * 4) <= 0.0) {
      *(float *)(CONCAT44(extraout_var,iVar1) + local_30 * 4) =
           in_XMM0_Da * *(float *)(lVar2 + local_30 * 4);
    }
    else {
      *(undefined4 *)(CONCAT44(extraout_var,iVar1) + local_30 * 4) =
           *(undefined4 *)(lVar2 + local_30 * 4);
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void leaky_relu (
            tensor& dest,
            const tensor& src,
            const float alpha
        )
        {
            const float* s = src.host();
            float* d = dest.host();
            for (size_t i = 0; i < dest.size(); ++i)
            {
                if (s[i] > 0)
                    d[i] = s[i];
                else
                    d[i] = alpha * s[i];
            }
        }